

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall google::protobuf::MapKey::SetType(MapKey *this,CppType type)

{
  string *psVar1;
  CppType type_local;
  MapKey *this_local;
  
  if (this->type_ != type) {
    if ((this->type_ == 9) && (psVar1 = (this->val_).string_value_, psVar1 != (string *)0x0)) {
      std::__cxx11::string::~string((string *)psVar1);
      operator_delete(psVar1,0x20);
    }
    this->type_ = type;
    if (this->type_ == 9) {
      psVar1 = (string *)operator_new(0x20);
      std::__cxx11::string::string((string *)psVar1);
      (this->val_).string_value_ = psVar1;
    }
  }
  return;
}

Assistant:

void SetType(FieldDescriptor::CppType type) {
    if (type_ == type) return;
    if (type_ == FieldDescriptor::CPPTYPE_STRING) {
      delete val_.string_value_;
    }
    type_ = type;
    if (type_ == FieldDescriptor::CPPTYPE_STRING) {
      val_.string_value_ = new string;
    }
  }